

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void SerializeMany<DataStream,std::array<unsigned_char,4ul>,char[12],unsigned_int,unsigned_char[4]>
               (DataStream *s,array<unsigned_char,_4UL> *args,char (*args_1) [12],uint *args_2,
               uchar (*args_3) [4])

{
  long lVar1;
  array<unsigned_char,_4UL> *in_RDX;
  DataStream *in_RSI;
  long in_FS_OFFSET;
  DataStream *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<DataStream,_unsigned_char,_4UL>(in_RSI,in_RDX);
  Serialize<DataStream,_char,_12>(in_RSI,(char (*) [12])in_RDX);
  Serialize<DataStream>(in_stack_ffffffffffffffc8,0);
  Serialize<DataStream,_unsigned_char,_4>(in_RSI,in_RDX->_M_elems);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}